

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O0

vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> * __thiscall
duckdb::MetaPipeline::AddDependenciesFrom
          (MetaPipeline *this,Pipeline *dependant,Pipeline *start,bool including)

{
  bool bVar1;
  type pPVar2;
  Pipeline *in_RCX;
  Pipeline *in_RDX;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *in_RDI;
  byte in_R8B;
  shared_ptr<duckdb::Pipeline,_true> *created_pipeline;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *__range1;
  mapped_type *explicit_deps;
  iterator it;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *created_pipelines;
  Pipeline *in_stack_ffffffffffffff08;
  unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
  *in_stack_ffffffffffffff10;
  int iVar3;
  value_type *in_stack_ffffffffffffff18;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  *in_stack_ffffffffffffff20;
  undefined1 local_a0 [24];
  __normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
  local_88 [3];
  unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
  *local_70;
  shared_ptr<duckdb::Pipeline,_true> *local_68;
  shared_ptr<duckdb::Pipeline,_true> *local_50;
  undefined1 local_41;
  shared_ptr<duckdb::Pipeline,_true> *local_40;
  shared_ptr<duckdb::Pipeline,_true> *local_38;
  __normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
  local_30;
  byte local_21;
  Pipeline *local_20;
  undefined8 local_18;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_30._M_current =
       (shared_ptr<duckdb::Pipeline,_true> *)
       ::std::
       vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
       ::begin((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                *)in_stack_ffffffffffffff08);
  while( true ) {
    __gnu_cxx::
    __normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
    ::operator*(&local_30);
    pPVar2 = shared_ptr<duckdb::Pipeline,_true>::operator*
                       ((shared_ptr<duckdb::Pipeline,_true> *)in_stack_ffffffffffffff10);
    bVar1 = RefersToSameObject<duckdb::Pipeline>(pPVar2,local_20);
    iVar3 = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_38 = (shared_ptr<duckdb::Pipeline,_true> *)
               __gnu_cxx::
               __normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
               ::operator++((__normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
                             *)in_stack_ffffffffffffff18,iVar3);
  }
  if ((local_21 & 1) == 0) {
    local_40 = (shared_ptr<duckdb::Pipeline,_true> *)
               __gnu_cxx::
               __normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
               ::operator++((__normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
                             *)in_stack_ffffffffffffff18,iVar3);
  }
  local_41 = 0;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true>::vector
            ((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *)0x98f469);
  while( true ) {
    local_50 = (shared_ptr<duckdb::Pipeline,_true> *)
               ::std::
               vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
               ::end((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                      *)in_stack_ffffffffffffff08);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
    ::operator*(&local_30);
    pPVar2 = shared_ptr<duckdb::Pipeline,_true>::operator*
                       ((shared_ptr<duckdb::Pipeline,_true> *)in_stack_ffffffffffffff10);
    bVar1 = RefersToSameObject<duckdb::Pipeline>(pPVar2,(Pipeline *)local_18);
    if (!bVar1) {
      __gnu_cxx::
      __normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
      ::operator*(&local_30);
      ::std::
      vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
      ::push_back(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
    local_68 = (shared_ptr<duckdb::Pipeline,_true> *)
               __gnu_cxx::
               __normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
               ::operator++((__normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
                             *)in_stack_ffffffffffffff18,
                            (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  }
  ::std::reference_wrapper<duckdb::Pipeline>::
  reference_wrapper<duckdb::Pipeline&,void,duckdb::Pipeline*>
            ((reference_wrapper<duckdb::Pipeline> *)in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  local_70 = (unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
              *)::std::
                unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
                ::operator[](in_stack_ffffffffffffff10,(key_type *)in_stack_ffffffffffffff08);
  local_88[0]._M_current =
       (shared_ptr<duckdb::Pipeline,_true> *)
       ::std::
       vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
       ::begin((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                *)in_stack_ffffffffffffff08);
  local_a0._16_8_ =
       ::std::
       vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
       ::end((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
              *)in_stack_ffffffffffffff08);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
                             *)in_stack_ffffffffffffff10,
                            (__normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
                             *)in_stack_ffffffffffffff08), bVar1) {
    local_a0._8_8_ =
         __gnu_cxx::
         __normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
         ::operator*(local_88);
    in_stack_ffffffffffffff10 = local_70;
    shared_ptr<duckdb::Pipeline,_true>::operator*((shared_ptr<duckdb::Pipeline,_true> *)local_70);
    in_stack_ffffffffffffff08 = (Pipeline *)local_a0;
    ::std::reference_wrapper<duckdb::Pipeline>::
    reference_wrapper<duckdb::Pipeline&,void,duckdb::Pipeline*>
              ((reference_wrapper<duckdb::Pipeline> *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
    ::std::
    vector<std::reference_wrapper<duckdb::Pipeline>,_std::allocator<std::reference_wrapper<duckdb::Pipeline>_>_>
    ::push_back((vector<std::reference_wrapper<duckdb::Pipeline>,_std::allocator<std::reference_wrapper<duckdb::Pipeline>_>_>
                 *)in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
    __gnu_cxx::
    __normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>_>
    ::operator++(local_88);
  }
  return in_RDI;
}

Assistant:

vector<shared_ptr<Pipeline>> MetaPipeline::AddDependenciesFrom(Pipeline &dependant, const Pipeline &start,
                                                               const bool including) {
	// find 'start'
	auto it = pipelines.begin();
	for (; !RefersToSameObject(**it, start); it++) {
	}

	if (!including) {
		it++;
	}

	// collect pipelines that were created from then
	vector<shared_ptr<Pipeline>> created_pipelines;
	for (; it != pipelines.end(); it++) {
		if (RefersToSameObject(**it, dependant)) {
			// cannot depend on itself
			continue;
		}
		created_pipelines.push_back(*it);
	}

	// add them to the dependencies
	auto &explicit_deps = pipeline_dependencies[dependant];
	for (auto &created_pipeline : created_pipelines) {
		explicit_deps.push_back(*created_pipeline);
	}

	return created_pipelines;
}